

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_goto_tb(DisasContext_conflict14 *ctx,int n,target_ulong_conflict dest)

{
  TCGContext_conflict9 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict9 *tcg_ctx;
  target_ulong_conflict dest_local;
  int n_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  _Var1 = use_goto_tb(ctx,dest);
  if (_Var1) {
    tcg_gen_goto_tb_tricore(tcg_ctx_00,n);
    gen_save_pc(ctx,dest);
    tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)(ctx->base).tb,n);
  }
  else {
    gen_save_pc(ctx,dest);
    tcg_gen_lookup_and_goto_ptr_tricore(tcg_ctx_00);
  }
  return;
}

Assistant:

static inline void gen_goto_tb(DisasContext *ctx, int n, target_ulong dest)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (use_goto_tb(ctx, dest)) {
        tcg_gen_goto_tb(tcg_ctx, n);
        gen_save_pc(tcg_ctx, dest);
        tcg_gen_exit_tb(tcg_ctx, ctx->base.tb, n);
    } else {
        gen_save_pc(tcg_ctx, dest);
        if (ctx->base.singlestep_enabled) {
            save_cpu_state(ctx, 0);
            gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
        }
        tcg_gen_lookup_and_goto_ptr(tcg_ctx);
    }
}